

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.h
# Opt level: O1

bool __thiscall pbrt::Transform::HasScale(Transform *this,Float tolerance)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  Float FVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  undefined1 auVar12 [16];
  bool bVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  
  fVar1 = (this->m).m[0][0];
  fVar2 = (this->m).m[0][1];
  auVar17 = ZEXT816(0) << 0x40;
  fVar10 = fVar2 * 0.0;
  fVar3 = (this->m).m[0][2];
  auVar16 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 + fVar10)),ZEXT416((uint)fVar3),auVar17);
  fVar4 = (this->m).m[1][0];
  fVar5 = (this->m).m[1][1];
  fVar11 = fVar5 * 0.0;
  fVar6 = (this->m).m[1][2];
  auVar12 = vfmadd231ss_fma(ZEXT416((uint)(fVar4 + fVar11)),ZEXT416((uint)fVar6),auVar17);
  FVar7 = (this->m).m[2][0];
  fVar8 = (this->m).m[2][1];
  auVar18 = ZEXT416((uint)(fVar8 * 0.0));
  auVar14 = vaddss_avx512f(ZEXT416((uint)FVar7),auVar18);
  fVar9 = (this->m).m[2][2];
  auVar14 = vfmadd231ss_avx512f(auVar14,ZEXT416((uint)fVar9),auVar17);
  auVar15 = vmulss_avx512f(auVar14,auVar14);
  auVar14._8_4_ = 0x7fffffff;
  auVar14._0_8_ = 0x7fffffff7fffffff;
  auVar14._12_4_ = 0x7fffffff;
  auVar16 = vandps_avx512vl(ZEXT416((uint)(auVar16._0_4_ * auVar16._0_4_ +
                                           auVar12._0_4_ * auVar12._0_4_ + auVar15._0_4_ + -1.0)),
                            auVar14);
  bVar13 = true;
  if (auVar16._0_4_ <= tolerance) {
    auVar16 = vfmadd231ss_fma(ZEXT416((uint)fVar2),ZEXT416((uint)fVar1),auVar17);
    auVar16 = vfmadd231ss_fma(auVar16,ZEXT416((uint)fVar3),auVar17);
    auVar12 = vfmadd231ss_fma(ZEXT416((uint)fVar5),ZEXT416((uint)fVar4),auVar17);
    auVar12 = vfmadd231ss_fma(auVar12,ZEXT416((uint)fVar6),auVar17);
    auVar14 = vfmadd231ss_fma(ZEXT416((uint)fVar8),ZEXT416((uint)FVar7),auVar17);
    auVar14 = vfmadd231ss_fma(auVar14,ZEXT416((uint)fVar9),auVar17);
    auVar15._8_4_ = 0x7fffffff;
    auVar15._0_8_ = 0x7fffffff7fffffff;
    auVar15._12_4_ = 0x7fffffff;
    auVar16 = vandps_avx512vl(ZEXT416((uint)(auVar16._0_4_ * auVar16._0_4_ +
                                             auVar12._0_4_ * auVar12._0_4_ +
                                             auVar14._0_4_ * auVar14._0_4_ + -1.0)),auVar15);
    if (auVar16._0_4_ <= tolerance) {
      auVar16 = vfmadd213ss_fma(ZEXT416((uint)fVar1),auVar17,ZEXT416((uint)fVar10));
      fVar3 = fVar3 + auVar16._0_4_;
      auVar16 = vfmadd213ss_fma(ZEXT416((uint)fVar4),auVar17,ZEXT416((uint)fVar11));
      fVar6 = fVar6 + auVar16._0_4_;
      auVar16 = vfmadd213ss_fma(ZEXT416((uint)FVar7),auVar17,auVar18);
      fVar9 = fVar9 + auVar16._0_4_;
      auVar16._8_4_ = 0x7fffffff;
      auVar16._0_8_ = 0x7fffffff7fffffff;
      auVar16._12_4_ = 0x7fffffff;
      auVar16 = vandps_avx512vl(ZEXT416((uint)(fVar3 * fVar3 + fVar6 * fVar6 + fVar9 * fVar9 + -1.0)
                                       ),auVar16);
      bVar13 = tolerance < auVar16._0_4_;
    }
  }
  return bVar13;
}

Assistant:

inline Vector3<T> Transform::operator()(const Vector3<T> &v) const {
    T x = v.x, y = v.y, z = v.z;
    return Vector3<T>(m[0][0] * x + m[0][1] * y + m[0][2] * z,
                      m[1][0] * x + m[1][1] * y + m[1][2] * z,
                      m[2][0] * x + m[2][1] * y + m[2][2] * z);
}